

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractsocket.cpp
# Opt level: O0

int __thiscall QAbstractSocket::close(QAbstractSocket *this,int __fd)

{
  QAbstractSocketPrivate *pQVar1;
  QAbstractSocketPrivate *d;
  
  pQVar1 = d_func((QAbstractSocket *)0x25467b);
  QIODevice::close();
  if (pQVar1->state != UnconnectedState) {
    pQVar1 = (QAbstractSocketPrivate *)(**(code **)(*(long *)this + 0x100))();
  }
  return (int)pQVar1;
}

Assistant:

void QAbstractSocket::close()
{
    Q_D(QAbstractSocket);
#if defined(QABSTRACTSOCKET_DEBUG)
    qDebug("QAbstractSocket::close()");
#endif
    QIODevice::close();
    if (d->state != UnconnectedState)
        disconnectFromHost();
}